

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stlio.hpp
# Opt level: O3

void tyti::stl::write_binary<float,std::__cxx11::stringstream>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *out,
               basic_solid<float> *s)

{
  pointer puVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  long lVar7;
  size_t num_triangles;
  char header_buffer [80];
  ulong local_90;
  undefined1 local_88 [88];
  
  uVar2 = (s->header)._M_string_length;
  uVar4 = 0x50;
  if (uVar2 < 0x50) {
    uVar4 = uVar2;
  }
  if (uVar2 != 0) {
    memmove(local_88,(s->header)._M_dataplus._M_p,uVar2);
    if (0x4f < uVar2) goto LAB_00170031;
  }
  memset(local_88 + uVar4,0,0x50 - uVar4);
LAB_00170031:
  pbVar6 = out + 0x10;
  std::ostream::write((char *)pbVar6,(long)local_88);
  uVar2 = ((long)(s->normals).
                 super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(s->normals).
                 super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  local_90 = (ulong)(((long)(s->vertices).
                            super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(s->vertices).
                            super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555) /
             3;
  if (uVar2 <= local_90) {
    local_90 = uVar2;
  }
  std::ostream::write((char *)pbVar6,(long)&local_90);
  if (local_90 != 0) {
    lVar7 = 0x18;
    lVar3 = 0;
    lVar5 = 0;
    uVar2 = 0;
    do {
      std::ostream::write((char *)pbVar6,
                          (long)((s->normals).
                                 super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->data + lVar5);
      std::ostream::write((char *)pbVar6,
                          (long)(s->vertices).
                                super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-2].data + lVar7);
      std::ostream::write((char *)pbVar6,
                          (long)(s->vertices).
                                super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[-1].data + lVar7);
      std::ostream::write((char *)pbVar6,
                          (long)((s->vertices).
                                 super__Vector_base<tyti::stl::basic_vec3<float>,_std::allocator<tyti::stl::basic_vec3<float>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->data + lVar7);
      puVar1 = (s->attributes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if (uVar2 < (ulong)((long)(s->attributes).
                                super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 1)) {
        std::ostream::write((char *)pbVar6,(long)puVar1 + lVar3);
      }
      uVar2 = uVar2 + 1;
      lVar7 = lVar7 + 0x24;
      lVar5 = lVar5 + 0xc;
      lVar3 = lVar3 + 2;
    } while (uVar2 < local_90);
  }
  return;
}

Assistant:

void write_binary(streamT& out, const basic_solid<T>& s)
        {
            // fill header buffer
            const size_t HEADER_SIZE = 80;
            char header_buffer[HEADER_SIZE];
            const size_t to_write = std::min(s.header.size(), HEADER_SIZE);
            std::copy(s.header.begin(), s.header.end(), header_buffer);
            std::fill(header_buffer+to_write, header_buffer+HEADER_SIZE, char(0));
            
            out.write(header_buffer, 80);

            const size_t num_triangles{ std::min(s.normals.size(), s.vertices.size()/3) };

            out.write(reinterpret_cast<const char*>(&num_triangles), 4);

            for (size_t i = 0; i < num_triangles; ++i)
            {
                //we cannot do direct writ
                detail::write_vectorF32(out, s.normals[i].data);
                detail::write_vectorF32(out, s.vertices[3 * i + 0].data);
                detail::write_vectorF32(out, s.vertices[3 * i + 1].data);
                detail::write_vectorF32(out, s.vertices[3 * i + 2].data);
                if (i < s.attributes.size())
                    out.write(reinterpret_cast<const char*>(&s.attributes[i]), sizeof(uint16_t));
            }
        }